

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m256v.c
# Opt level: O2

void m256v_copy_row(m256v *M1,int r1,m256v *Mt,int rt)

{
  long lVar1;
  
  for (lVar1 = 0; lVar1 < Mt->n_col; lVar1 = lVar1 + 1) {
    Mt->e[lVar1 + Mt->rstride * (long)rt] = M1->e[lVar1 + M1->rstride * (long)r1];
  }
  return;
}

Assistant:

void m256v_copy_row(const m256v* M1,
			int r1,
			m256v* Mt,
			int rt)
{
	assert (M1->n_col == Mt->n_col);

	for (int i = 0; i < Mt->n_col; ++i) {
		set_el(Mt, rt, i, get_el(M1, r1, i));
	}
}